

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<char>_>::set
          (boundary_point_index_iterator<std::_List_iterator<char>_> *this,base_iterator p)

{
  bool bVar1;
  size_t sVar2;
  const_iterator cVar3;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  iterator_type in_RSI;
  iterator_type __s;
  char *__s_00;
  boundary_point_index_iterator<std::_List_iterator<char>_> *in_RDI;
  ptrdiff_t diff;
  const_iterator ptr;
  const_iterator e;
  const_iterator b;
  size_t dist;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  *in_stack_ffffffffffffff80;
  _List_iterator<char> in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  break_info *in_stack_ffffffffffffff98;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  in_stack_ffffffffffffffa8;
  
  mapping<std::_List_iterator<char>_>::begin(in_RDI->map_);
  __s._M_node = in_RSI._M_node;
  sVar2 = std::distance<std::_List_iterator<char>>
                    ((_List_iterator<char>)in_stack_ffffffffffffff90._M_current,
                     in_stack_ffffffffffffff88);
  index(in_RDI,(char *)__s._M_node,__c);
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::begin((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           *)in_RDI);
  index(in_RDI,(char *)__s._M_node,__c_00);
  cVar3 = std::
          vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
          ::end((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 *)in_RDI);
  break_info::break_info((break_info *)&stack0xffffffffffffffa0,sVar2);
  std::
  lower_bound<__gnu_cxx::__normal_iterator<booster::locale::boundary::break_info_const*,std::vector<booster::locale::boundary::break_info,std::allocator<booster::locale::boundary::break_info>>>,booster::locale::boundary::break_info>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  index(in_RDI,(char *)cVar3._M_current,__c_01);
  cVar3 = std::
          vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
          ::end((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 *)in_RDI);
  __s_00 = &stack0xffffffffffffff98;
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffff80,
                     (__normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                      *)in_RDI);
  if (bVar1) {
    sVar2 = size((boundary_point_index_iterator<std::_List_iterator<char>_> *)0x14cd28);
    in_RDI->current_ = sVar2 - 1;
  }
  else {
    index(in_RDI,__s_00,__c_02);
    in_stack_ffffffffffffff90 =
         std::
         vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
         ::begin((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  *)in_RDI);
    sVar2 = __gnu_cxx::operator-
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                        *)in_RDI);
    in_RDI->current_ = sVar2;
  }
  while (bVar1 = valid_offset((boundary_point_index_iterator<std::_List_iterator<char>_> *)
                              in_stack_ffffffffffffff90._M_current,
                              (size_t)in_stack_ffffffffffffff88._M_node), ((bVar1 ^ 0xffU) & 1) != 0
        ) {
    in_RDI->current_ = in_RDI->current_ + 1;
  }
  get_offset((boundary_point_index_iterator<std::_List_iterator<char>_> *)
             in_stack_ffffffffffffff88._M_node,(size_t)in_stack_ffffffffffffff80);
  std::advance<std::_List_iterator<char>,long>
            ((_List_iterator<char> *)in_stack_ffffffffffffffa0._M_current,(long)cVar3._M_current);
  boundary_point<std::_List_iterator<char>_>::iterator(&in_RDI->value_,in_RSI);
  update_rule((boundary_point_index_iterator<std::_List_iterator<char>_> *)in_RSI._M_node);
  return;
}

Assistant:

void set(base_iterator p)
                    {
                        size_t dist =  std::distance(map_->begin(),p);

                        index_type::const_iterator b=index().begin();
                        index_type::const_iterator e=index().end();
                        index_type::const_iterator ptr = std::lower_bound(b,e,break_info(dist));

                        if(ptr==index().end())
                            current_=size()-1;
                        else
                            current_=ptr - index().begin();

                        while(!valid_offset(current_))
                            current_ ++;

                        std::ptrdiff_t diff = get_offset(current_) - dist;
                        std::advance(p,diff);
                        value_.iterator(p);
                        update_rule();
                    }